

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::GetNearPlane(ON_Viewport *this,ON_Plane *near_plane)

{
  double dVar1;
  byte bVar2;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  bVar2 = this->m_bValidCamera & this->m_bValidFrustum;
  if (bVar2 == 1) {
    ::operator*(&local_60,this->m_frus_near,&this->m_CamZ);
    ON_3dPoint::operator-(&local_48,&this->m_CamLoc,&local_60);
    (near_plane->origin).z = local_48.z;
    (near_plane->origin).x = local_48.x;
    (near_plane->origin).y = local_48.y;
    (near_plane->xaxis).z = (this->m_CamX).z;
    dVar1 = (this->m_CamX).y;
    (near_plane->xaxis).x = (this->m_CamX).x;
    (near_plane->xaxis).y = dVar1;
    dVar1 = (this->m_CamY).y;
    (near_plane->yaxis).x = (this->m_CamY).x;
    (near_plane->yaxis).y = dVar1;
    (near_plane->yaxis).z = (this->m_CamY).z;
    dVar1 = (this->m_CamZ).y;
    (near_plane->zaxis).x = (this->m_CamZ).x;
    (near_plane->zaxis).y = dVar1;
    (near_plane->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(near_plane);
  }
  return (bool)bVar2;
}

Assistant:

bool ON_Viewport::GetNearPlane( ON_Plane& near_plane ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    near_plane.origin = m_CamLoc - m_frus_near*m_CamZ;
    near_plane.xaxis = m_CamX;
    near_plane.yaxis = m_CamY;
    near_plane.zaxis = m_CamZ;
    near_plane.UpdateEquation();
  }
  return rc;
}